

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O3

void __thiscall
phosg::BitmapImage::write_row(BitmapImage *this,size_t y,void *in_data,size_t size_bits)

{
  ulong uVar1;
  out_of_range *this_00;
  ulong __n;
  
  if (y < this->height) {
    uVar1 = this->row_bytes;
    __n = size_bits + 7 >> 3;
    if (uVar1 < __n) {
      __n = uVar1;
    }
    memcpy(this->data + y * uVar1,in_data,__n);
    return;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  ::std::out_of_range::out_of_range(this_00,"out of bounds");
  __cxa_throw(this_00,&::std::out_of_range::typeinfo,::std::out_of_range::~out_of_range);
}

Assistant:

void BitmapImage::write_row(size_t y, const void* in_data, size_t size_bits) {
  if (y >= this->height) {
    throw out_of_range("out of bounds");
  }
  memcpy(&this->data[y * this->row_bytes], in_data, min<size_t>(byte_count_for_bit_count(size_bits), row_bytes));
}